

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_dist_clone(llama_sampler *smpl)

{
  long lVar1;
  llama_sampler *plVar2;
  long in_RDI;
  llama_sampler_dist *result_ctx;
  llama_sampler *result;
  llama_sampler_dist *ctx;
  
  lVar1 = *(long *)(in_RDI + 8);
  plVar2 = llama_sampler_init_dist((uint32_t)((ulong)lVar1 >> 0x20));
  memcpy((void *)((long)plVar2->ctx + 8),(void *)(lVar1 + 8),5000);
  return plVar2;
}

Assistant:

static struct llama_sampler * llama_sampler_dist_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (const llama_sampler_dist *) smpl->ctx;
    auto * result = llama_sampler_init_dist(ctx->seed);

    // copy the state
    {
        auto * result_ctx = (llama_sampler_dist *) result->ctx;

        result_ctx->rng = ctx->rng;
    }

    return result;
}